

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageio.h
# Opt level: O0

ImageSpec * __thiscall ImageInput::spec(ImageInput *this,uint32_t param_2,uint32_t param_3)

{
  size_type sVar1;
  size_type sVar2;
  ImageSpec *in_RSI;
  ImageSpec *in_RDI;
  ImageSpec *ret;
  ImageSpec *in_stack_ffffffffffffffa8;
  ImageSpec *this_00;
  
  this_00 = in_RDI;
  ImageSpec::ImageSpec(in_RSI);
  sVar1 = in_RSI[5].formatDesc.extended.iccProfile.name._M_string_length;
  sVar2 = Imageio::std::vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_>::size
                    ((vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_> *)
                     &in_RSI[5].formatDesc.extended);
  if ((uint)sVar1 < sVar2) {
    Imageio::std::vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_>::operator[]
              ((vector<ImageInput::imageInfo,_std::allocator<ImageInput::imageInfo>_> *)
               &in_RSI[5].formatDesc.extended,
               (ulong)(uint)in_RSI[5].formatDesc.extended.iccProfile.name._M_string_length);
    ImageSpec::operator=(this_00,in_stack_ffffffffffffffa8);
  }
  return in_RDI;
}

Assistant:

virtual ImageSpec spec (uint32_t /*subimage*/, uint32_t /*miplevel=0*/) {
        ImageSpec ret;
        if (curSubimage < images.size()) {
            ret = images[curSubimage].spec;
        }
        return ret;
    }